

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

bool __thiscall
LowererMDArch::GenerateFastDivAndRem(LowererMDArch *this,Instr *instrDiv,LabelInstr *bailOutLabel)

{
  RegOpnd *opnd;
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  RegOpnd *this_01;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  RegOpnd *dstOpnd;
  Instr *instr;
  
  if (instrDiv == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xc0f,"(instrDiv)","instrDiv");
    if (!bVar2) goto LAB_0065200b;
    *puVar4 = 0;
  }
  this_01 = (RegOpnd *)instrDiv->m_src1;
  if (((this_01->super_Opnd).m_type | TyInt64) == TyUint32) {
    opnd = (RegOpnd *)instrDiv->m_dst;
    this_00 = instrDiv->m_src2;
    OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar3 == OpndKindReg) {
      OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) {
LAB_0065200b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      bVar2 = IR::RegOpnd::IsSameRegUntyped(this_01,(Opnd *)opnd);
      if ((bVar2) &&
         ((instrDiv->m_opcode == Rem_I4 ||
          (bailOutLabel != (LabelInstr *)0x0 || instrDiv->m_opcode == RemU_I4)))) {
        this_01 = IR::RegOpnd::New(TyInt32,instrDiv->m_func);
        Lowerer::InsertMove(&this_01->super_Opnd,instrDiv->m_src1,instrDiv,true);
      }
    }
    this_02 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
    this_03 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,BitopsFastPathPhase,sourceContextId,functionId);
    if ((!bVar2) && (OVar3 = IR::Opnd::GetKind(this_00), OVar3 == OpndKindIntConst)) {
      switch(instrDiv->m_opcode) {
      case Div_I4:
      case Rem_I4:
        bVar2 = GenerateFastDivAndRem_Signed(this,instrDiv);
        break;
      case DivU_I4:
      case RemU_I4:
        bVar2 = GenerateFastDivAndRem_Unsigned(this,instrDiv);
        break;
      default:
        bVar2 = false;
      }
      if (bVar2 == false) {
        return false;
      }
      if ((instrDiv->m_opcode == Rem_I4) ||
         (bailOutLabel != (LabelInstr *)0x0 || instrDiv->m_opcode == RemU_I4)) {
        dstOpnd = opnd;
        if (bailOutLabel != (LabelInstr *)0x0) {
          dstOpnd = IR::RegOpnd::New(TyInt32,instrDiv->m_func);
        }
        instr = IR::Instr::New(IMUL2,&dstOpnd->super_Opnd,(Opnd *)opnd,this_00,instrDiv->m_func);
        IR::Instr::InsertBefore(instrDiv,instr);
        LowererMD::Legalize<false>(instr,false);
        Lowerer::InsertSub(false,&dstOpnd->super_Opnd,&this_01->super_Opnd,&dstOpnd->super_Opnd,
                           instrDiv);
        if (bailOutLabel != (LabelInstr *)0x0) {
          Lowerer::InsertTestBranch
                    (&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,BrNeq_A,bailOutLabel,instrDiv);
        }
      }
      IR::Instr::Remove(instrDiv);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool LowererMDArch::GenerateFastDivAndRem(IR::Instr* instrDiv, IR::LabelInstr* bailOutLabel)
{
    Assert(instrDiv);
    IR::Opnd* divident  = instrDiv->GetSrc1(); // nominator
    IR::Opnd* divisor   = instrDiv->GetSrc2(); // denominator
    IR::Opnd* dst       = instrDiv->GetDst();

    if (divident->GetType() != TyInt32 && divident->GetType() != TyUint32)
    {
        return false;
    }

    if (divident->IsRegOpnd() && divident->AsRegOpnd()->IsSameRegUntyped(dst))
    {
        if (instrDiv->m_opcode == Js::OpCode::Rem_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4 || bailOutLabel)
        {
            divident = IR::RegOpnd::New(TyInt32, instrDiv->m_func);
            Lowerer::InsertMove(divident, instrDiv->GetSrc1(), instrDiv);
        }
    }

    if (PHASE_OFF(Js::BitopsFastPathPhase, this->m_func) || !divisor->IsIntConstOpnd())
    {
        return false;
    }

    bool success = false;
    if (instrDiv->m_opcode == Js::OpCode::DivU_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4)
    {
        success = GenerateFastDivAndRem_Unsigned(instrDiv);
    }
    else if (instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4)
    {
        success = GenerateFastDivAndRem_Signed(instrDiv);
    }

    if (!success)
    {
        return false;
    }
    // For reminder/mod ops
    if (instrDiv->m_opcode == Js::OpCode::Rem_I4 || instrDiv->m_opcode == Js::OpCode::RemU_I4 || bailOutLabel)
    {
        // For q = n/d
        // mul dst, dst, divident
        // sub dst, divident, dst
        IR::Opnd* reminderOpnd = dst;;
        if (bailOutLabel)
        {
            reminderOpnd = IR::RegOpnd::New(TyInt32, instrDiv->m_func);
        }

        IR::Instr* imul = IR::Instr::New(LowererMD::MDImulOpcode, reminderOpnd, dst, divisor, instrDiv->m_func);
        instrDiv->InsertBefore(imul);
        LowererMD::Legalize(imul);
        Lowerer::InsertSub(false, reminderOpnd, divident, reminderOpnd, instrDiv);
        if (bailOutLabel)
        {
            Lowerer::InsertTestBranch(reminderOpnd, reminderOpnd, Js::OpCode::BrNeq_A, bailOutLabel, instrDiv);
        }
    }

    // DIV/REM has been optimized and can be removed now.
    instrDiv->Remove();
    return true;
}